

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gguf.cpp
# Opt level: O0

void * gguf_get_arr_data(gguf_context *ctx,int64_t key_id)

{
  int64_t iVar1;
  const_reference this;
  gguf_type *pgVar2;
  char *pcVar3;
  size_type in_RSI;
  long in_RDI;
  
  if (-1 < (long)in_RSI) {
    iVar1 = gguf_get_n_kv((gguf_context *)0x18f179);
    if ((long)in_RSI < iVar1) {
      this = std::vector<gguf_kv,_std::allocator<gguf_kv>_>::operator[]
                       ((vector<gguf_kv,_std::allocator<gguf_kv>_> *)(in_RDI + 8),in_RSI);
      pgVar2 = gguf_kv::get_type(this);
      if (*pgVar2 == GGUF_TYPE_STRING) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/gguf.cpp"
                   ,0x30c,"GGML_ASSERT(%s) failed","ctx->kv[key_id].get_type() != GGUF_TYPE_STRING")
        ;
      }
      std::vector<gguf_kv,_std::allocator<gguf_kv>_>::operator[]
                ((vector<gguf_kv,_std::allocator<gguf_kv>_> *)(in_RDI + 8),in_RSI);
      pcVar3 = std::vector<signed_char,_std::allocator<signed_char>_>::data
                         ((vector<signed_char,_std::allocator<signed_char>_> *)0x18f206);
      return pcVar3;
    }
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/gguf.cpp"
             ,0x30b,"GGML_ASSERT(%s) failed","key_id >= 0 && key_id < gguf_get_n_kv(ctx)");
}

Assistant:

const void * gguf_get_arr_data(const struct gguf_context * ctx, int64_t key_id) {
    GGML_ASSERT(key_id >= 0 && key_id < gguf_get_n_kv(ctx));
    GGML_ASSERT(ctx->kv[key_id].get_type() != GGUF_TYPE_STRING);
    return ctx->kv[key_id].data.data();
}